

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O1

void __thiscall
kws::Parser::FindProtectedArea(Parser *this,size_t *before,size_t *after,size_t startPos)

{
  size_t sVar1;
  ulong uVar2;
  size_t position;
  string local_70;
  string local_50;
  
  *before = 0;
  *after = 0;
  sVar1 = FindArea(this,"public",startPos);
  uVar2 = FindArea(this,"private",startPos);
  position = FindArea(this,"protected",startPos);
  if (uVar2 == 0xffffffffffffffff) {
    uVar2 = 99999999;
  }
  if (position == 0xffffffffffffffff) {
    position = 99999999;
  }
  if (sVar1 == 0xffffffffffffffff) {
    sVar1 = 99999999;
  }
  if (uVar2 < position || sVar1 < position) {
    if (position < uVar2 || sVar1 < position) {
      *before = position;
      if ((uVar2 < position || position < sVar1) &&
         (uVar2 = FindEndOfClass(this,position), uVar2 == 0xffffffffffffffff)) {
        uVar2 = position;
      }
    }
    else {
      *before = position;
      uVar2 = sVar1;
    }
  }
  else {
    *before = position;
    if (sVar1 <= uVar2) {
      uVar2 = sVar1;
    }
  }
  *after = uVar2;
  if (uVar2 == 99999999) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    sVar1 = GetClassPosition(this,startPos,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((sVar1 != 0xffffffffffffffff) &&
       (sVar1 = std::__cxx11::string::find((char *)&this->m_BufferNoComment,0x16acee,sVar1),
       sVar1 != 0xffffffffffffffff)) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
      sVar1 = FindClosingChar(this,'{','}',sVar1,true,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (sVar1 != 0xffffffffffffffff) {
        *after = sVar1;
      }
    }
  }
  return;
}

Assistant:

void Parser::FindProtectedArea(size_t &before, size_t &after, size_t startPos) const
{
  before = 0;
  after = 0;

  // First look if public is before protected and private
  size_t pub = this->FindArea("public", startPos);
  size_t priv = this->FindArea("private", startPos);
  size_t protect = this->FindArea("protected", startPos);

  if(priv == std::string::npos)
    {
    priv = MAX_CHAR;
    }

  if(protect == std::string::npos)
    {
    protect = MAX_CHAR;
    }

  if(pub == std::string::npos)
    {
    pub = MAX_CHAR;
    }

  if(protect>priv || protect>pub)
     {
     if(protect>=priv && protect<=pub)
       {
       before = protect;
       after = pub;
       }
     else if(protect<=priv && protect>=pub)
       {
       before = protect;
       after = priv;
       }
     else
       {
       before = protect;
       size_t eoc = this->FindEndOfClass(protect);
       if(eoc != std::string::npos)
         {
         after = eoc;
         }
       else
         {
         after = protect; // end of class
         }
       }
     }
  else
    {
    before = protect;
    if(priv<pub)
      {
      after = priv;
      }
    else
      {
      after = pub;
      }
    }


  // If there is nothing after we point to the end of the class
  if(after == MAX_CHAR)
    {
    size_t classpos = this->GetClassPosition(startPos);
    if(classpos != std::string::npos)
      {
      size_t posBrace = m_BufferNoComment.find("{",classpos);
      if(posBrace != std::string::npos)
        {
        size_t end = this->FindClosingChar('{','}',posBrace,true);
        if(end != std::string::npos)
          {
          after = end;
          }
        }
      }
    }
}